

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O3

void cf_poly1305_finish(cf_poly1305 *ctx,uint8_t *out)

{
  undefined4 uVar1;
  size_t sVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  ulong uVar6;
  undefined1 auVar7 [13];
  int i;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  cf_poly1305 *pcVar11;
  uint32_t *puVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  uint32_t c [17];
  uint32_t s [17];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined4 local_68;
  int aiStack_58 [18];
  
  bVar13 = 0;
  sVar2 = ctx->npartial;
  if (sVar2 != 0) {
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_68 = 0;
    sVar9 = 0;
    do {
      *(uint *)(local_a8 + sVar9 * 4) = (uint)ctx->partial[sVar9];
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
    *(undefined4 *)(local_a8 + sVar2 * 4) = 1;
    poly1305_block(ctx,(uint32_t *)local_a8);
  }
  lVar8 = 0;
  do {
    uVar1 = *(undefined4 *)(ctx->s + lVar8);
    uVar6 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar6;
    auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar4[8] = (char)((uint)uVar1 >> 0x10);
    auVar4._0_8_ = uVar6;
    auVar4[9] = 0;
    auVar4._10_3_ = auVar3._10_3_;
    auVar7._5_8_ = 0;
    auVar7._0_5_ = auVar4._8_5_;
    auVar14._0_4_ = (undefined4)uVar6;
    auVar5[4] = (char)((uint)uVar1 >> 8);
    auVar5._0_4_ = auVar14._0_4_;
    auVar5[5] = 0;
    auVar5._6_7_ = SUB137(auVar7 << 0x40,6);
    auVar14._4_9_ = auVar5._4_9_;
    auVar14._13_3_ = 0;
    *(undefined1 (*) [16])(aiStack_58 + lVar8) = auVar14;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  aiStack_58[0x10] = 0;
  pcVar11 = ctx;
  puVar12 = (uint32_t *)local_a8;
  for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar12 = pcVar11->h[0];
    pcVar11 = (cf_poly1305 *)((long)pcVar11 + (ulong)bVar13 * -8 + 4);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  lVar8 = 0;
  uVar10 = 0;
  do {
    uVar10 = uVar10 + *(int *)(local_a8 + lVar8) + *(int *)((long)negative_1305 + lVar8);
    *(uint *)(local_a8 + lVar8) = uVar10 & 0xff;
    uVar10 = uVar10 >> 8;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x44);
  lVar8 = 0;
  do {
    puVar12 = (uint32_t *)(local_a8 + lVar8 * 4);
    if ((char)local_68 < '\0') {
      puVar12 = ctx->h + lVar8;
    }
    ctx->h[lVar8] = *puVar12;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x11);
  lVar8 = 0;
  uVar10 = 0;
  do {
    uVar10 = uVar10 + ctx->h[lVar8] + aiStack_58[lVar8];
    ctx->h[lVar8] = uVar10 & 0xff;
    uVar10 = uVar10 >> 8;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x11);
  lVar8 = 0;
  do {
    out[lVar8] = (uint8_t)ctx->h[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x10);
  memset(ctx,0,0xb0);
  return;
}

Assistant:

void cf_poly1305_finish(cf_poly1305 *ctx,
                        uint8_t out[16])
{
  if (ctx->npartial)
    poly1305_last_block(ctx);

  uint32_t s[17];
  size_t i;
  for (i = 0; i < 16; i++)
    s[i] = ctx->s[i];
  s[16] = 0;

  poly1305_full_reduce(ctx->h);
  poly1305_add(ctx->h, s);

  for (i = 0; i < 16; i++)
    out[i] = ctx->h[i];

  mem_clean(ctx, sizeof *ctx);
}